

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O0

void __thiscall
cppnet::ThreadSafeQueue<cppnet::Log_*>::Push(ThreadSafeQueue<cppnet::Log_*> *this,Log **element)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  Log **element_local;
  ThreadSafeQueue<cppnet::Log_*> *this_local;
  
  lock._8_8_ = element;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->_mutex);
  std::queue<cppnet::Log_*,_std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>_>::push
            (&this->_queue,(value_type *)lock._8_8_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void Push(const T& element) {
        std::unique_lock<std::mutex> lock(_mutex);
        _queue.push(element);
    }